

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenTupleExtract(BinaryenModuleRef module,BinaryenExpressionRef tuple,BinaryenIndex index)

{
  TupleExtract *pTVar1;
  Builder local_28;
  Index local_1c;
  BinaryenExpressionRef pEStack_18;
  BinaryenIndex index_local;
  BinaryenExpressionRef tuple_local;
  BinaryenModuleRef module_local;
  
  local_1c = index;
  pEStack_18 = tuple;
  tuple_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_28,module);
  pTVar1 = wasm::Builder::makeTupleExtract(&local_28,pEStack_18,local_1c);
  return (BinaryenExpressionRef)pTVar1;
}

Assistant:

BinaryenExpressionRef BinaryenTupleExtract(BinaryenModuleRef module,
                                           BinaryenExpressionRef tuple,
                                           BinaryenIndex index) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeTupleExtract((Expression*)tuple, index));
}